

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

void duckdb::GenerateUUIDv4Function(DataChunk *args,ExpressionState *state,Vector *result)

{
  FunctionLocalState *pFVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  optional_ptr<duckdb::FunctionLocalState,_true> local_28;
  
  local_28.ptr = *(FunctionLocalState **)(state + 0xb0);
  pFVar1 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->(&local_28);
  duckdb::Vector::SetVectorType((VectorType)result);
  puVar3 = (undefined8 *)(*(long *)(result + 0x20) + 8);
  for (uVar2 = 0; uVar2 < *(ulong *)(args + 0x18); uVar2 = uVar2 + 1) {
    auVar4 = duckdb::UUID::GenerateRandomUUID((RandomEngine *)(pFVar1 + 8));
    puVar3[-1] = auVar4._0_8_;
    *puVar3 = auVar4._8_8_;
    puVar3 = puVar3 + 2;
  }
  return;
}

Assistant:

static void GenerateUUIDv4Function(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 0);
	auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<RandomLocalState>();

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto result_data = FlatVector::GetData<hugeint_t>(result);

	for (idx_t i = 0; i < args.size(); i++) {
		result_data[i] = UUIDv4::GenerateRandomUUID(lstate.random_engine);
	}
}